

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/catch.hpp:9754:33)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_serge_sans_paille[P]frozen_tests_catch_hpp:9754:33)>
          *this,string *arg)

{
  int iVar1;
  time_t tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_80,arg);
  local_58 = 0;
  local_60 = &PTR__BasicResult_001cfc08;
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_80,"time");
  if (iVar1 == 0) {
    tVar2 = time((time_t *)0x0);
    ((this->m_lambda).config)->rngSeed = (uint)tVar2;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cfc08;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    convertInto<unsigned_int>(__return_storage_ptr__,&local_80,&((this->m_lambda).config)->rngSeed);
  }
  local_60 = &PTR__BasicResult_001cfc08;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }